

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O3

bool __thiscall chrono::ChDirectSolverLS::Setup(ChDirectSolverLS *this,ChSystemDescriptor *sysd)

{
  ChSparseMatrix *this_00;
  pointer pcVar1;
  int *piVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Scalar unVal;
  rep_conflict rVar7;
  ChLog *pCVar8;
  ChStreamOutAscii *pCVar9;
  long lVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  byte bVal;
  ChDirectSolverLS *pCVar13;
  byte bVal_00;
  undefined1 auVar14 [16];
  ChSparsityPatternLearner sparsity_pattern;
  scalar_sum_op<int,_int> local_e1;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [7];
  double local_38;
  double *pdStack_30;
  
  rVar7 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_assembly).m_start.__d.__r = rVar7;
  iVar5 = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  iVar6 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  this->m_dim = iVar6 + iVar5;
  if (this->m_use_learner == true) {
    if (this->m_force_update == false) {
      bVal = false;
      bVal_00 = this->m_lock ^ 1;
    }
    else {
      bVal_00 = true;
      bVal = false;
    }
  }
  else {
    if (this->m_setup_call == 0) {
      bVal = 1;
    }
    else {
      bVal = this->m_lock ^ 1;
    }
    bVal_00 = false;
  }
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    pCVar8 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii,"Solver setup\n");
    pCVar8 = GetLog();
    pCVar9 = ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii,"  call number:    ");
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,this->m_setup_call);
    ChStreamOutAscii::operator<<(pCVar9,"\n");
    pCVar8 = GetLog();
    pCVar9 = ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii,"  use learner?    ");
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,this->m_use_learner);
    ChStreamOutAscii::operator<<(pCVar9,"\n");
    pCVar8 = GetLog();
    pCVar9 = ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii,"  pattern locked? ");
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,this->m_lock);
    ChStreamOutAscii::operator<<(pCVar9,"\n");
    pCVar8 = GetLog();
    pCVar9 = ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii,"  CALL learner:   ");
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,(bool)bVal_00);
    ChStreamOutAscii::operator<<(pCVar9,"\n");
    pCVar8 = GetLog();
    pCVar9 = ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii,"  CALL reserve:   ");
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,(bool)bVal);
    ChStreamOutAscii::operator<<(pCVar9,"\n");
  }
  if ((bool)bVal_00 == false) {
    if ((bool)bVal != false) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = this->m_sparsity;
      uVar3 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar14,1);
      bVar4 = (bool)((byte)uVar3 & 1);
      local_38 = (double)((ulong)bVar4 * (long)(1.0 - this->m_sparsity) +
                         (ulong)!bVar4 * 0x3fb9999999999998);
      pdStack_30 = (double *)0x0;
      Eigen::SparseMatrix<double,_1,_int>::resize(&this->m_mat,(long)this->m_dim,(long)this->m_dim);
      local_c0._M_allocated_capacity = (size_type)this->m_dim;
      local_c0._12_4_ = (int)((double)this->m_dim * local_38);
      if ((long)local_c0._M_allocated_capacity < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                     );
      }
      Eigen::SparseMatrix<double,1,int>::
      reserveInnerVectors<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
                ((SparseMatrix<double,1,int> *)&this->m_mat,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)&local_c0);
    }
  }
  else {
    ChSparsityPatternLearner::ChSparsityPatternLearner
              ((ChSparsityPatternLearner *)&local_c0,this->m_dim,this->m_dim);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&local_c0,0);
    ChSparsityPatternLearner::Apply((ChSparsityPatternLearner *)&local_c0,&this->m_mat);
    this->m_force_update = false;
    ChSparsityPatternLearner::~ChSparsityPatternLearner((ChSparsityPatternLearner *)&local_c0);
  }
  this_00 = &this->m_mat;
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,this_00,0);
  Eigen::SparseMatrix<double,_1,_int>::makeCompressed(this_00);
  lVar10 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_assembly).m_end.__d.__r = lVar10;
  (this->m_timer_setup_assembly).m_total.__r =
       (double)(lVar10 - (this->m_timer_setup_assembly).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_setup_assembly).m_total.__r;
  if ((this->super_ChSolverLS).super_ChSolver.write_matrix == true) {
    pCVar13 = (ChDirectSolverLS *)local_e0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar13,
                   "LS_",&(this->super_ChSolverLS).super_ChSolver.frame_id);
    plVar11 = (long *)std::__cxx11::string::append((char *)pCVar13);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar12) {
      local_b0[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_b0[0]._8_8_ = plVar11[3];
      local_c0._M_allocated_capacity = (size_type)local_b0;
    }
    else {
      local_b0[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_c0._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar11;
    }
    local_c0._8_8_ = plVar11[1];
    *plVar11 = (long)paVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    WriteMatrix(pCVar13,(string *)&local_c0,this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_allocated_capacity != local_b0) {
      operator_delete((void *)local_c0._M_allocated_capacity,
                      (ulong)(local_b0[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ != &local_d0) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._M_allocated_capacity + 1));
    }
  }
  rVar7 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_solvercall).m_start.__d.__r = rVar7;
  iVar5 = (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xc])(this);
  lVar10 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_solvercall).m_end.__d.__r = lVar10;
  (this->m_timer_setup_solvercall).m_total.__r =
       (double)(lVar10 - (this->m_timer_setup_solvercall).m_start.__d.__r) / 1000000000.0 +
       (this->m_timer_setup_solvercall).m_total.__r;
  if ((this->super_ChSolverLS).super_ChSolver.write_matrix == true) {
    pCVar13 = (ChDirectSolverLS *)local_e0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar13,
                   "LS_",&(this->super_ChSolverLS).super_ChSolver.frame_id);
    plVar11 = (long *)std::__cxx11::string::append((char *)pCVar13);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar12) {
      local_b0[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_b0[0]._8_8_ = plVar11[3];
      local_c0._M_allocated_capacity = (size_type)local_b0;
    }
    else {
      local_b0[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_c0._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar11;
    }
    local_c0._8_8_ = plVar11[1];
    *plVar11 = (long)paVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    WriteMatrix(pCVar13,(string *)&local_c0,this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_allocated_capacity != local_b0) {
      operator_delete((void *)local_c0._M_allocated_capacity,
                      (ulong)(local_b0[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ != &local_d0) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._M_allocated_capacity + 1));
    }
  }
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    pCVar8 = GetLog();
    pCVar9 = ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii," Solver setup [");
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,this->m_setup_call);
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,"] n = ");
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,this->m_dim);
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,"  nnz = ");
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->m_mat).m_innerNonZeros;
    if (paVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      piVar2 = (this->m_mat).m_outerIndex;
      unVal = piVar2[(this->m_mat).m_outerSize] - *piVar2;
    }
    else {
      pcVar1 = (pointer)(this->m_mat).m_outerSize;
      if (pcVar1 == (pointer)0x0) {
        unVal = 0;
      }
      else {
        local_e0._0_8_ = paVar12;
        local_e0._8_8_ = pcVar1;
        if ((long)pcVar1 < 0) {
          __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                        "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<int, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<int, -1, 1>>, Level = 0]"
                       );
        }
        local_c0._M_allocated_capacity = (size_type)paVar12;
        local_b0[0]._0_8_ = pcVar1;
        unVal = Eigen::internal::
                redux_impl<Eigen::internal::scalar_sum_op<int,int>,Eigen::internal::redux_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,3,0>
                ::run<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                          ((redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                            *)&local_c0,&local_e1,
                           (Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>
                            *)local_e0);
      }
    }
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,unVal);
    ChStreamOutAscii::operator<<(pCVar9,"\n");
    pCVar8 = GetLog();
    pCVar9 = ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii,"  assembly matrix:   ");
    lVar10 = std::chrono::_V2::system_clock::now();
    pCVar9 = ChStreamOutAscii::operator<<
                       (pCVar9,(double)(lVar10 - (this->m_timer_setup_assembly).m_start.__d.__r) /
                               1000000000.0);
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,"s\n");
    pCVar9 = ChStreamOutAscii::operator<<(pCVar9,"  analyze+factorize: ");
    lVar10 = std::chrono::_V2::system_clock::now();
    pCVar9 = ChStreamOutAscii::operator<<
                       (pCVar9,(double)(lVar10 - (this->m_timer_setup_solvercall).m_start.__d.__r) /
                               1000000000.0);
    ChStreamOutAscii::operator<<(pCVar9,"s\n");
  }
  this->m_setup_call = this->m_setup_call + 1;
  if (SUB41(iVar5,0) == false) {
    pCVar8 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar8->super_ChStreamOutAscii,"Solver setup failed\n");
    (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xe])(this);
  }
  return SUB41(iVar5,0);
}

Assistant:

bool ChDirectSolverLS::Setup(ChSystemDescriptor& sysd) {
    m_timer_setup_assembly.start();

    // Calculate problem size.
    // Note that ChSystemDescriptor::UpdateCountsAndOffsets was already called at the beginning of the step.
    m_dim = sysd.CountActiveVariables() + sysd.CountActiveConstraints();

    // If use of the sparsity pattern learner is enabled, call it if:
    // (a) an explicit update was requested (by default this is true at the first call), or
    // (b) the sparsity pattern is not locked and so has to be re-evaluated at each call
    bool call_learner = m_use_learner && (m_force_update || !m_lock);

    // If use of the sparsity pattern learner is disabled, reserve space for nonzeros,
    // using the current sparsity level estimate, if:
    // (a) this is the first call to setup, or
    // (b) the sparsity pattern is not locked and so has to be re-evaluated at each call
    bool call_reserve = !m_use_learner && (m_setup_call == 0 || !m_lock);

    if (verbose) {
        GetLog() << "Solver setup\n";
        GetLog() << "  call number:    " << m_setup_call << "\n";
        GetLog() << "  use learner?    " << m_use_learner << "\n";
        GetLog() << "  pattern locked? " << m_lock << "\n";
        GetLog() << "  CALL learner:   " << call_learner << "\n";
        GetLog() << "  CALL reserve:   " << call_reserve << "\n";
    }

    if (call_learner) {
        ChSparsityPatternLearner sparsity_pattern(m_dim, m_dim);
        sysd.ConvertToMatrixForm(&sparsity_pattern, nullptr);
        sparsity_pattern.Apply(m_mat);
        m_force_update = false;
    } else if (call_reserve) {
        double density = (m_sparsity > 0) ? 1 - m_sparsity : 1 - SPM_DEF_SPARSITY;
        m_mat.resize(m_dim, m_dim);
        m_mat.reserve(Eigen::VectorXi::Constant(m_dim, static_cast<int>(m_dim * density)));
    }

    // Let the system descriptor load the current matrix
    sysd.ConvertToMatrixForm(&m_mat, nullptr);

    // Allow the matrix to be compressed
    m_mat.makeCompressed();

    m_timer_setup_assembly.stop();

    if (write_matrix)
        WriteMatrix("LS_" + frame_id + "_A.dat", m_mat);

    // Let the concrete solver perform the facorization
    m_timer_setup_solvercall.start();
    bool result = FactorizeMatrix();
    m_timer_setup_solvercall.stop();

    if (write_matrix)
        WriteMatrix("LS_" + frame_id + "_F.dat", m_mat);

    if (verbose) {
        GetLog() << " Solver setup [" << m_setup_call << "] n = " << m_dim << "  nnz = " << (int)m_mat.nonZeros()
                 << "\n";
        GetLog() << "  assembly matrix:   " << m_timer_setup_assembly.GetTimeSecondsIntermediate() << "s\n"
                 << "  analyze+factorize: " << m_timer_setup_solvercall.GetTimeSecondsIntermediate() << "s\n";
    }

    m_setup_call++;

    if (!result) {
        // If the factorization failed, let the concrete solver display an error message.
        GetLog() << "Solver setup failed\n";
        PrintErrorMessage();
    }

    return result;
}